

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O2

void EvaluateEncodings_rec(DdManager *dd,DdNode *bVarsCol,int nVarsCol,int nMulti,int Level)

{
  long lVar1;
  DdNode *pDVar2;
  ulong uVar3;
  DdNode *n;
  undefined4 in_register_0000000c;
  DdNode **ppDVar4;
  long lVar5;
  int nMulti_00;
  double dVar6;
  uint nMint1;
  uint nMint0;
  uint local_80;
  uint local_7c;
  undefined8 local_78;
  long local_70;
  DdNode *local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdNode **local_38;
  
  local_78 = CONCAT44(in_register_0000000c,nMulti);
  if (((Level < 6) && (pDVar2 = dd->one, pDVar2 != bVarsCol)) && (s_BackTracks < 0x65)) {
    s_BackTracks = s_BackTracks + 1;
    local_50 = (ulong)(Level - 1U);
    nMulti_00 = nMulti + -1;
    uVar3 = 0;
    if (0 < Level) {
      uVar3 = (ulong)(uint)Level;
    }
    local_70 = local_50 << 0xb;
    local_58 = uVar3 << 2;
    for (local_48 = bVarsCol; local_48 != pDVar2; local_48 = (local_48->type).kids.T) {
      local_68 = dd->vars[local_48->index];
      s_VarOrderCur[local_50] = local_48->index;
      local_40 = (DdNode *)((ulong)local_68 ^ 1);
      local_60 = 0;
      ppDVar4 = s_Field[(uint)Level] + 1;
      for (lVar5 = 0; lVar1 = local_70, (uint)lVar5 >> ((byte)(Level - 1U) & 0x1f) == 0;
          lVar5 = lVar5 + 1) {
        local_38 = ppDVar4;
        pDVar2 = ComputeVarSetAndCountMinterms
                           (dd,*(DdNode **)((long)s_Field[0] + local_70 + lVar5 * 8),local_40,
                            &local_7c);
        Cudd_Ref(pDVar2);
        uVar3 = (ulong)local_7c;
        dVar6 = Extra_Power2(nMulti_00);
        if (dVar6 < (double)uVar3) goto LAB_00757591;
        n = ComputeVarSetAndCountMinterms
                      (dd,*(DdNode **)((long)s_Field[0] + lVar5 * 8 + lVar1),local_68,&local_80);
        Cudd_Ref(n);
        uVar3 = (ulong)local_80;
        dVar6 = Extra_Power2(nMulti_00);
        if (dVar6 < (double)uVar3) {
          Cudd_RecursiveDeref(dd,pDVar2);
          pDVar2 = n;
          goto LAB_00757591;
        }
        (*(DdNode *(*) [256])(local_38 + -1))[0] = pDVar2;
        *local_38 = n;
        ppDVar4 = local_38 + 2;
        local_60 = (ulong)((int)local_60 + 1);
      }
      if (s_nVarsBest < Level) {
        s_nVarsBest = Level;
        for (lVar5 = 0; local_58 != lVar5; lVar5 = lVar5 + 4) {
          *(undefined4 *)((long)s_VarOrderBest + lVar5) =
               *(undefined4 *)((long)s_VarOrderCur + lVar5);
        }
      }
      if (1 < (int)local_78) {
        pDVar2 = Cudd_bddExistAbstract(dd,bVarsCol,local_68);
        Cudd_Ref(pDVar2);
        EvaluateEncodings_rec(dd,pDVar2,nVarsCol + -1,nMulti_00,Level + 1);
LAB_00757591:
        Cudd_RecursiveDeref(dd,pDVar2);
      }
      uVar3 = local_60 & 0xffffffff;
      for (lVar5 = 0; uVar3 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)s_Field[(uint)Level] + lVar5));
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)(s_Field[(uint)Level] + 1) + lVar5));
      }
      if (s_nVarsBest == 5) {
        return;
      }
      if (s_nVarsBest == s_MultiStart) {
        return;
      }
      pDVar2 = dd->one;
    }
  }
  return;
}

Assistant:

void EvaluateEncodings_rec( DdManager * dd, DdNode * bVarsCol, int nVarsCol, int nMulti, int Level )
// bVarsCol is the set of remaining variables
// nVarsCol is the number of remaining variables
// nMulti is the number of encoding variables to be used
// Level is the level of recursion, from which this function is called
// if we successfully finish this procedure, Level also stands for how many encoding variabled we saved
{
    int i, k;
    int nEntries = (1<<(Level-1)); // the number of entries in the field of the previous level
    DdNode * bVars0, * bVars1; // the cofactors
    unsigned nMint0, nMint1;   // the number of minterms
    DdNode * bTempV;
    DdNode * bVarTop;
    int fBreak;


    // there is no need to search above this level
    if ( Level > s_MaxDepth )
        return;

    // if there are no variables left, quit the research
    if ( bVarsCol == b1 )
        return;

    if ( s_BackTracks > s_BackTrackLimit )
        return;

    s_BackTracks++;

    // otherwise, go through the remaining variables
    for ( bTempV = bVarsCol; bTempV != b1; bTempV = cuddT(bTempV) )
    {
        // the currently tested variable
        bVarTop = dd->vars[bTempV->index];

        // put it into the array
        s_VarOrderCur[Level-1] = bTempV->index;

        // go through the entries and fill them out by cofactoring
        fBreak = 0;
        for ( i = 0; i < nEntries; i++ )
        {
            bVars0 = ComputeVarSetAndCountMinterms( dd, s_Field[Level-1][i], Cudd_Not(bVarTop), &nMint0 );
            Cudd_Ref( bVars0 );

            if ( nMint0 > Extra_Power2( nMulti-1 ) ) 
            {
                // there is no way to encode - dereference and return
                Cudd_RecursiveDeref( dd, bVars0 );
                fBreak = 1;
                break;
            }

            bVars1 = ComputeVarSetAndCountMinterms( dd, s_Field[Level-1][i], bVarTop, &nMint1 );
            Cudd_Ref( bVars1 );

            if ( nMint1 > Extra_Power2( nMulti-1 ) ) 
            {
                // there is no way to encode - dereference and return
                Cudd_RecursiveDeref( dd, bVars0 );
                Cudd_RecursiveDeref( dd, bVars1 );
                fBreak = 1;
                break;
            }

            // otherwise, add these two cofactors
            s_Field[Level][2*i + 0] = bVars0; // takes ref
            s_Field[Level][2*i + 1] = bVars1; // takes ref
        } 

        if ( !fBreak )
        {
            DdNode * bVarsRem;
            // if we ended up here, it means that the cofactors w.r.t. variable bVarTop satisfy the condition
            // save this situation
            if ( s_nVarsBest < Level )
            {
                s_nVarsBest = Level;
                // copy the variable assignment
                for ( k = 0; k < Level; k++ )
                    s_VarOrderBest[k] = s_VarOrderCur[k];
            }

            // call recursively
            // get the new variable set
            if ( nMulti-1 > 0 )
            {
                bVarsRem = Cudd_bddExistAbstract( dd, bVarsCol, bVarTop );   Cudd_Ref( bVarsRem );
                EvaluateEncodings_rec( dd, bVarsRem, nVarsCol-1, nMulti-1, Level+1 );
                Cudd_RecursiveDeref( dd, bVarsRem );
            }
        }

        // deref the contents of the array
        for ( k = 0; k < i; k++ )
        {
            Cudd_RecursiveDeref( dd, s_Field[Level][2*k + 0] );
            Cudd_RecursiveDeref( dd, s_Field[Level][2*k + 1] );
        }

        // if the solution is found, there is no need to continue
        if ( s_nVarsBest == s_MaxDepth )
            return;

        // if the solution is found, there is no need to continue
        if ( s_nVarsBest == s_MultiStart )
            return;
    }
    // at this point, we have tried all possible directions in the space of variables
}